

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LocalSingleStoreElimPass::RewriteDebugDeclares
          (LocalSingleStoreElimPass *this,Instruction *store_inst,uint32_t var_id)

{
  bool bVar1;
  bool bVar2;
  uint32_t value_id_00;
  IRContext *pIVar3;
  DebugInfoManager *pDVar4;
  bool modified;
  uint32_t value_id;
  uint32_t var_id_local;
  Instruction *store_inst_local;
  LocalSingleStoreElimPass *this_local;
  
  value_id_00 = opt::Instruction::GetSingleWordInOperand(store_inst,1);
  pIVar3 = Pass::context(&this->super_Pass);
  pDVar4 = IRContext::get_debug_info_mgr(pIVar3);
  bVar1 = analysis::DebugInfoManager::AddDebugValueForVariable
                    (pDVar4,store_inst,var_id,value_id_00,store_inst);
  pIVar3 = Pass::context(&this->super_Pass);
  pDVar4 = IRContext::get_debug_info_mgr(pIVar3);
  bVar2 = analysis::DebugInfoManager::KillDebugDeclares(pDVar4,var_id);
  return bVar1 || bVar2;
}

Assistant:

bool LocalSingleStoreElimPass::RewriteDebugDeclares(Instruction* store_inst,
                                                    uint32_t var_id) {
  uint32_t value_id = store_inst->GetSingleWordInOperand(1);
  bool modified = context()->get_debug_info_mgr()->AddDebugValueForVariable(
      store_inst, var_id, value_id, store_inst);
  modified |= context()->get_debug_info_mgr()->KillDebugDeclares(var_id);
  return modified;
}